

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_2_5::TiledInputFile::numLevels(TiledInputFile *this)

{
  LevelMode LVar1;
  ostream *poVar2;
  char *pcVar3;
  LogicExc *this_00;
  TiledInputFile *in_RDI;
  stringstream _iex_throw_s;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  LVar1 = levelMode(in_RDI);
  if (LVar1 == RIPMAP_LEVELS) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"Error calling numLevels() on image file \"");
    pcVar3 = fileName((TiledInputFile *)0x7e4fcd);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\" (numLevels() is not defined for files with RIPMAP level mode).");
    this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_00,local_190);
    __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  return in_RDI->_data->numXLevels;
}

Assistant:

int
TiledInputFile::numLevels () const
{
    if (levelMode() == RIPMAP_LEVELS)
	THROW (IEX_NAMESPACE::LogicExc, "Error calling numLevels() on image "
			      "file \"" << fileName() << "\" "
			      "(numLevels() is not defined for files "
			      "with RIPMAP level mode).");

    return _data->numXLevels;
}